

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

bool spvIsExtendedInstruction(Op opcode)

{
  return opcode == OpExtInstWithForwardRefsKHR || opcode == OpExtInst;
}

Assistant:

bool spvIsExtendedInstruction(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpExtInst:
    case spv::Op::OpExtInstWithForwardRefsKHR:
      return true;
    default:
      return false;
  }
}